

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementNSImpl.cpp
# Opt level: O2

int __thiscall xercesc_4_0::DOMElementNSImpl::rename(DOMElementNSImpl *this,char *__old,char *__new)

{
  DOMAttrMapImpl *this_00;
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  long lVar3;
  DOMNodeImpl *this_01;
  DOMException *this_02;
  
  setName(this,(XMLCh *)__old,(XMLCh *)__new);
  this_00 = (this->super_DOMElementImpl).fAttributes;
  iVar1 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0x4a])(this);
  DOMAttrMapImpl::reconcileDefaultAttributes(this_00,(DOMAttrMapImpl *)CONCAT44(extraout_var,iVar1))
  ;
  plVar2 = (long *)__dynamic_cast(this,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                  0xfffffffffffffffe);
  if (plVar2 != (long *)0x0) {
    lVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
    if (lVar3 != 0) {
      this_01 = (DOMNodeImpl *)(**(code **)(*plVar2 + 0x10))(plVar2);
      DOMNodeImpl::callUserDataHandlers(this_01,NODE_RENAMED,(DOMNode *)this,(DOMNode *)this);
      return (int)this;
    }
  }
  this_02 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
  __cxa_throw(this_02,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode* DOMElementNSImpl::rename(const XMLCh* namespaceURI, const XMLCh* name)
{
    setName(namespaceURI, name);
    fAttributes->reconcileDefaultAttributes(getDefaultAttributes());
    // and fire user data NODE_RENAMED event
    castToNodeImpl(this)->callUserDataHandlers(DOMUserDataHandler::NODE_RENAMED, this, this);

    return this;
}